

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Image * Image::readPNG(Image *__return_storage_ptr__,path *filename)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  png_structp ppVar3;
  long lVar4;
  __jmp_buf_tag *__env;
  runtime_error *this;
  Size newSize;
  png_uint_32 height;
  png_uint_32 width;
  png_structp pngPtr;
  long local_88;
  path *local_80;
  int color_type;
  int bit_depth;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Image(__return_storage_ptr__,(Size)0x0,(Color)0x0);
  pngPtr = (png_structp)0x0;
  local_80 = filename;
  __stream = fopen((filename->_M_pathname)._M_dataplus._M_p,"rb");
  if (__stream == (FILE *)0x0) goto LAB_0010555c;
  ppVar3 = (png_structp)png_create_read_struct("1.6.37",0,0);
  pngPtr = ppVar3;
  if ((ppVar3 == (png_structp)0x0) || (lVar4 = png_create_info_struct(ppVar3), lVar4 == 0)) {
    lVar4 = 0;
LAB_00105434:
    bVar1 = false;
  }
  else {
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(ppVar3,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 != 0) goto LAB_00105434;
    png_init_io(ppVar3,__stream);
    png_read_info(ppVar3,lVar4);
    png_get_IHDR(ppVar3,lVar4,&width,&height,&bit_depth,&color_type,0,0,0);
    png_set_strip_16(ppVar3);
    png_set_expand(ppVar3);
    png_set_gray_to_rgb(ppVar3);
    png_set_add_alpha(ppVar3,0xff,1);
    png_read_update_info(ppVar3,lVar4);
    newSize.height = height;
    newSize.width = width;
    fastResize(__return_storage_ptr__,newSize);
    local_88 = lVar4;
    for (iVar2 = 0; iVar2 < (__return_storage_ptr__->size).height; iVar2 = iVar2 + 1) {
      png_read_row(ppVar3,(__return_storage_ptr__->colorData).
                          super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (long)iVar2 * (long)(__return_storage_ptr__->size).width,0);
    }
    bVar1 = true;
    lVar4 = local_88;
  }
  fclose(__stream);
  if (lVar4 != 0) {
    png_free_data(ppVar3,lVar4,0xffff,0xffffffffffffffff);
  }
  if (ppVar3 != (png_structp)0x0) {
    png_destroy_read_struct(&pngPtr,0);
  }
  if (bVar1) {
    return __return_storage_ptr__;
  }
LAB_0010555c:
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::filesystem::__cxx11::path::string(&local_70,local_80);
  std::operator+(&local_50,"Failed to read PNG from ",&local_70);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Image Image::readPNG(const fs::path &filename) {
	Image out;
	bool success = false;
	png_structp pngPtr = NULL;
	png_infop infoPtr = NULL;

	FILE *file = FOPEN(filename.c_str(), "rb");
	if (!file) { goto finalize; }

	pngPtr = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
	if (!pngPtr) { goto finalize; }

	infoPtr = png_create_info_struct(pngPtr);
	if (!infoPtr) { goto finalize; }

	if (setjmp(png_jmpbuf(pngPtr))) { goto finalize; }

	png_init_io(pngPtr, file);
	png_read_info(pngPtr, infoPtr);

	png_uint_32 width, height;
	int bit_depth, color_type;
	png_get_IHDR(pngPtr, infoPtr, &width, &height, &bit_depth, &color_type, NULL, NULL, NULL);
	png_set_strip_16(pngPtr);
	png_set_expand(pngPtr);
	png_set_gray_to_rgb(pngPtr);
	png_set_add_alpha(pngPtr, 0xFF, PNG_FILLER_AFTER);
	png_read_update_info(pngPtr, infoPtr);

	out.fastResize({static_cast<int>(width), static_cast<int>(height)});
	for (int y = 0; y < out.size.height; y++) {
		png_read_row(pngPtr, (png_bytep)&out.pixel(0, y), NULL);
	}

	success = true;

finalize:
	if (file) { fclose(file); }
	if (infoPtr) { png_free_data(pngPtr, infoPtr, PNG_FREE_ALL, -1); }
	if (pngPtr) { png_destroy_read_struct(&pngPtr, NULL, NULL); }
	if (success) {
		return out;
	} else {
		throw std::runtime_error("Failed to read PNG from " + filename.string());
	}
}